

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlIconvWrapper(iconv_t cd,uchar *out,int *outlen,uchar *in,int *inlen)

{
  size_t sVar1;
  int *piVar2;
  uchar *puStack_58;
  int ret;
  char *icv_out;
  char *icv_in;
  size_t icv_outlen;
  size_t icv_inlen;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  iconv_t cd_local;
  
  if ((((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) ||
     (in == (uchar *)0x0)) {
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
    cd_local._4_4_ = -1;
  }
  else {
    icv_outlen = (size_t)*inlen;
    icv_in = (char *)(long)*outlen;
    puStack_58 = out;
    icv_out = (char *)in;
    icv_inlen = (size_t)inlen;
    inlen_local = (int *)in;
    in_local = (uchar *)outlen;
    outlen_local = (int *)out;
    out_local = (uchar *)cd;
    sVar1 = iconv(cd,&icv_out,&icv_outlen,(char **)&stack0xffffffffffffffa8,(size_t *)&icv_in);
    *(int *)icv_inlen = *(int *)icv_inlen - (int)icv_outlen;
    *(int *)in_local = *(int *)in_local - (int)icv_in;
    if ((icv_outlen == 0) && ((int)sVar1 != -1)) {
      cd_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0x54) {
        cd_local._4_4_ = -2;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 7) {
          cd_local._4_4_ = -1;
        }
        else {
          piVar2 = __errno_location();
          if (*piVar2 == 0x16) {
            cd_local._4_4_ = -3;
          }
          else {
            cd_local._4_4_ = -3;
          }
        }
      }
    }
  }
  return cd_local._4_4_;
}

Assistant:

static int
xmlIconvWrapper(iconv_t cd, unsigned char *out, int *outlen,
                const unsigned char *in, int *inlen) {
    size_t icv_inlen, icv_outlen;
    const char *icv_in = (const char *) in;
    char *icv_out = (char *) out;
    int ret;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL)) {
        if (outlen != NULL) *outlen = 0;
        return(-1);
    }
    icv_inlen = *inlen;
    icv_outlen = *outlen;
    ret = iconv(cd, (ICONV_CONST char **) &icv_in, &icv_inlen, &icv_out, &icv_outlen);
    *inlen -= icv_inlen;
    *outlen -= icv_outlen;
    if ((icv_inlen != 0) || (ret == -1)) {
#ifdef EILSEQ
        if (errno == EILSEQ) {
            return -2;
        } else
#endif
#ifdef E2BIG
        if (errno == E2BIG) {
            return -1;
        } else
#endif
#ifdef EINVAL
        if (errno == EINVAL) {
            return -3;
        } else
#endif
        {
            return -3;
        }
    }
    return 0;
}